

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# oonf_class.c
# Opt level: O3

void oonf_class_event(oonf_class *c,void *ptr,oonf_class_event evt)

{
  char *pcVar1;
  oonf_log_source source;
  char *pcVar2;
  list_entity *plVar3;
  int line;
  list_entity *plVar4;
  oonf_objectkey_str buf;
  
  source = _oonf_class_subsystem.logging;
  if ((log_global_mask[_oonf_class_subsystem.logging] & 1) != 0) {
    pcVar1 = OONF_CLASS_EVENT_NAME[evt];
    pcVar2 = (*c->to_keystring)(&buf,c,ptr);
    oonf_log(LOG_SEVERITY_DEBUG,source,"src/base/oonf_class.c",0x143,(void *)0x0,0,
             "Fire \'%s\' event for %s",pcVar1,pcVar2);
  }
  plVar4 = (c->_extensions).next;
  do {
    if (plVar4->prev == (c->_extensions).prev) {
      if ((log_global_mask[_oonf_class_subsystem.logging] & 1) != 0) {
        oonf_log(LOG_SEVERITY_DEBUG,_oonf_class_subsystem.logging,"src/base/oonf_class.c",0x152,
                 (void *)0x0,0,"Fire event finished");
      }
      return;
    }
    if (evt == OONF_OBJECT_CHANGED) {
      plVar3 = plVar4[-1].next;
      if (plVar3 != (list_entity *)0x0) {
        if ((log_global_mask[_oonf_class_subsystem.logging] & 1) != 0) {
          plVar3 = plVar4 + -1;
          line = 0x14e;
          goto LAB_00111ddd;
        }
        goto LAB_00111dfe;
      }
    }
    else if (evt == OONF_OBJECT_REMOVED) {
      plVar3 = plVar4[-1].prev;
      if (plVar3 != (list_entity *)0x0) {
        if ((log_global_mask[_oonf_class_subsystem.logging] & 1) != 0) {
          plVar3 = (list_entity *)&plVar4[-1].prev;
          line = 0x14a;
          goto LAB_00111ddd;
        }
        goto LAB_00111dfe;
      }
    }
    else if ((evt == OONF_OBJECT_ADDED) && (plVar3 = plVar4[-2].prev, plVar3 != (list_entity *)0x0))
    {
      if ((log_global_mask[_oonf_class_subsystem.logging] & 1) != 0) {
        plVar3 = (list_entity *)&plVar4[-2].prev;
        line = 0x146;
LAB_00111ddd:
        oonf_log(LOG_SEVERITY_DEBUG,_oonf_class_subsystem.logging,"src/base/oonf_class.c",line,
                 (void *)0x0,0,"Fire listener %s",plVar4[-4].prev);
        plVar3 = plVar3->next;
      }
LAB_00111dfe:
      (*(code *)plVar3)(ptr);
    }
    plVar4 = plVar4->next;
  } while( true );
}

Assistant:

void
oonf_class_event(struct oonf_class *c, void *ptr, enum oonf_class_event evt) {
  struct oonf_class_extension *ext;
#ifdef OONF_LOG_DEBUG_INFO
  struct oonf_objectkey_str buf;
#endif

  OONF_DEBUG(LOG_CLASS, "Fire '%s' event for %s", OONF_CLASS_EVENT_NAME[evt], c->to_keystring(&buf, c, ptr));
  list_for_each_element(&c->_extensions, ext, _node) {
    if (evt == OONF_OBJECT_ADDED && ext->cb_add != NULL) {
      OONF_DEBUG(LOG_CLASS, "Fire listener %s", ext->ext_name);
      ext->cb_add(ptr);
    }
    else if (evt == OONF_OBJECT_REMOVED && ext->cb_remove != NULL) {
      OONF_DEBUG(LOG_CLASS, "Fire listener %s", ext->ext_name);
      ext->cb_remove(ptr);
    }
    else if (evt == OONF_OBJECT_CHANGED && ext->cb_change != NULL) {
      OONF_DEBUG(LOG_CLASS, "Fire listener %s", ext->ext_name);
      ext->cb_change(ptr);
    }
  }
  OONF_DEBUG(LOG_CLASS, "Fire event finished");
}